

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolveMember
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  Alias *this_00;
  _Self local_150;
  _Self local_148;
  iterator iter_1;
  ResolvedDecl local_128;
  undefined1 local_c8 [8];
  ResolveResult result;
  Node *node;
  _Self local_50;
  iterator iter;
  Content *content;
  CompiledModule *local_38;
  Content *_content899;
  Node *local_28;
  Node *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (Node *)name.content.ptr;
  local_28 = this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  if ((this->isBuiltin & 1U) != 0) {
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::Maybe(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  getContent((Node *)&content,(State)this);
  local_38 = (CompiledModule *)
             kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                       ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&content);
  if (local_38 != (CompiledModule *)0x0) {
    iter._M_node = (_Base_ptr)local_38;
    local_50._M_node =
         (_Base_ptr)
         std::
         multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
         ::find((NestedNodesMap *)&local_38->parserModule,(key_type *)&this_local);
    node = (Node *)std::
                   multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                   ::end((multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                          *)&(iter._M_node)->_M_parent);
    bVar1 = std::operator==(&local_50,(_Self *)&node);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>
               ::operator->(&local_50);
      result.field_1._88_8_ = kj::Own::operator_cast_to_Node_((Own *)&ppVar2->second);
      kj::
      OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
      OneOf((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
             *)local_c8);
      local_128.id = *(uint64_t *)(result.field_1._88_8_ + 0x48);
      local_128.genericParamCount = *(uint *)(result.field_1._88_8_ + 100);
      local_128.scopeId = this->id;
      local_128.kind = *(Which *)(result.field_1._88_8_ + 0x60);
      local_128.resolver = (Resolver *)result.field_1._88_8_;
      kj::Maybe<capnp::schema::Brand::Reader>::Maybe(&local_128.brand);
      kj::
      OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>::
      init<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedDecl>
                ((OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>
                  *)local_c8,&local_128);
      Resolver::ResolvedDecl::~ResolvedDecl(&local_128);
      kj::
      Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
      ::Maybe(__return_storage_ptr__,
              (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
               *)local_c8);
      kj::
      OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
      ~OneOf((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
              *)local_c8);
      return __return_storage_ptr__;
    }
    local_148._M_node =
         (_Base_ptr)
         std::
         multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
         ::find((multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
                 *)&iter._M_node[2]._M_right,(key_type *)&this_local);
    local_150._M_node =
         (_Base_ptr)
         std::
         multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
         ::end((multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
                *)&iter._M_node[2]._M_right);
    bVar1 = std::operator==(&local_148,&local_150);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>
               ::operator->(&local_148);
      this_00 = kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>::operator->
                          (&ppVar3->second);
      Alias::compile(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
  }
  kj::
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult>
Compiler::Node::resolveMember(kj::StringPtr name) {
  if (isBuiltin) return kj::none;

  KJ_IF_SOME(content, getContent(Content::EXPANDED)) {
    {
      auto iter = content.nestedNodes.find(name);
      if (iter != content.nestedNodes.end()) {
        Node* node = iter->second;
        ResolveResult result;
        result.init<ResolvedDecl>(ResolvedDecl {
            node->id, node->genericParamCount, id, node->kind, node, kj::none });
        return result;
      }
    }
    {
      auto iter = content.aliases.find(name);
      if (iter != content.aliases.end()) {
        return iter->second->compile();
      }
    }
  }
  return kj::none;
}